

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frozen_benchmark.c
# Opt level: O3

void save(char *buf,size_t len)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  FILE *pFVar6;
  char *pcVar7;
  void *__ptr;
  size_t sVar8;
  char *__ptr_00;
  undefined8 *puVar9;
  roaring_bitmap_t *prVar10;
  uint64_t uVar11;
  size_t __size;
  undefined8 uVar12;
  char cVar13;
  long extraout_RDX;
  void *unaff_RBP;
  uint uVar14;
  char *pcVar15;
  FILE *unaff_R13;
  undefined8 *puVar16;
  stat sStack_120;
  FILE *pFStack_90;
  char *pcStack_88;
  FILE *pFStack_80;
  undefined8 *puStack_78;
  roaring_bitmap_t *prStack_70;
  code *pcStack_68;
  long lStack_60;
  undefined8 *puStack_58;
  undefined8 *puStack_50;
  FILE *pFStack_48;
  
  uVar14 = 0x241;
  uVar2 = open("/tmp/roaring.bin",0x241,0x1b6);
  if (uVar2 != 0xffffffff) {
    unaff_RBP = (void *)(ulong)uVar2;
    if (len != 0) {
      do {
        pcVar15 = buf;
        sVar5 = write(uVar2,buf,len);
        uVar14 = (uint)pcVar15;
        if (sVar5 == -1) {
          die("write");
          goto LAB_001013b1;
        }
        buf = buf + sVar5;
        len = len - sVar5;
      } while ((FILE *)len != (FILE *)0x0);
    }
    close(uVar2);
    return;
  }
LAB_001013b1:
  pcVar15 = "open";
  die("open");
  if ((int)uVar14 < 1) {
    return;
  }
  puStack_50 = (undefined8 *)(ulong)uVar14;
  puVar16 = (undefined8 *)0x0;
  lStack_60 = extraout_RDX;
  pFStack_48 = (FILE *)len;
LAB_001013e4:
  pcVar7 = *(char **)(lStack_60 + (long)puVar16 * 8);
  pcStack_68 = (code *)0x1013fb;
  pFVar6 = fopen(pcVar7,"r");
  puStack_58 = puVar16;
  if (pFVar6 == (FILE *)0x0) {
    pcStack_68 = (code *)0x101586;
    printf("Could not open file %s\n",pcVar7);
  }
  else {
    pcStack_68 = (code *)0x10141b;
    fseek(pFVar6,0,2);
    pcStack_68 = (code *)0x101423;
    pcVar7 = (char *)ftell(pFVar6);
    pcStack_68 = (code *)0x10142e;
    rewind(pFVar6);
    pcStack_68 = (code *)0x101438;
    __ptr = malloc((size_t)(pcVar7 + 1));
    len = (size_t)pFVar6;
    if (__ptr == (void *)0x0) {
      pcStack_68 = (code *)0x101590;
      fclose(pFVar6);
    }
    else {
      pcStack_68 = (code *)0x101457;
      sVar8 = fread(__ptr,(size_t)pcVar7,1,pFVar6);
      unaff_RBP = __ptr;
      if (sVar8 == 1) {
        *(char *)((long)__ptr + (long)pcVar7) = '\0';
        pcStack_68 = (code *)0x10146f;
        fclose(pFVar6);
        unaff_R13 = (FILE *)0x1;
        puVar16 = (undefined8 *)0x0;
        do {
          if (*(char *)((long)__ptr + (long)puVar16) == ',') {
            unaff_R13 = (FILE *)((long)&unaff_R13->_flags + 1);
          }
          else if (*(char *)((long)__ptr + (long)puVar16) == '\0') goto LAB_00101491;
          puVar16 = (undefined8 *)((long)puVar16 + 1);
        } while( true );
      }
      pcStack_68 = (code *)0x10159a;
      free(__ptr);
    }
  }
  goto LAB_0010159a;
LAB_00101491:
  pcStack_68 = (code *)0x10149e;
  __ptr_00 = (char *)malloc((long)unaff_R13 * 4);
  if (__ptr_00 != (char *)0x0) {
    if (puVar16 == (undefined8 *)0x0) {
      len = 0;
    }
    else {
      puVar9 = (undefined8 *)0x0;
      len = 0;
      do {
        cVar13 = *(char *)((long)__ptr + (long)puVar9);
        while( true ) {
          if (cVar13 == '\0') goto LAB_0010150f;
          if (0xf5 < (byte)(cVar13 - 0x3aU)) break;
          cVar13 = *(char *)((long)__ptr + 1 + (long)puVar9);
          puVar9 = (undefined8 *)((long)puVar9 + 1);
        }
        uVar2 = (uint)(byte)(cVar13 - 0x30);
        cVar13 = *(char *)((long)__ptr + 1 + (long)puVar9);
        while ((byte)(cVar13 - 0x30U) < 10) {
          uVar2 = (uint)(byte)(cVar13 - 0x30) + uVar2 * 10;
          pcVar7 = (char *)((long)__ptr + 2 + (long)puVar9);
          puVar9 = (undefined8 *)((long)puVar9 + 1);
          cVar13 = *pcVar7;
        }
        *(uint *)(__ptr_00 + len * 4) = uVar2;
        len = (long)&((FILE *)len)->_flags + 1;
        puVar9 = (undefined8 *)((long)puVar9 + 2);
      } while (puVar9 < puVar16);
    }
LAB_0010150f:
    if ((FILE *)len != unaff_R13) {
      pcStack_68 = (code *)0x101527;
      printf("unexpected number of integers! %d %d \n",len & 0xffffffff,
             (ulong)unaff_R13 & 0xffffffff);
    }
    pcStack_68 = (code *)0x10152f;
    free(__ptr);
    pcVar7 = __ptr_00;
    if ((FILE *)len != (FILE *)0x0) {
      pFVar6 = (FILE *)0x0;
      do {
        pcStack_68 = (code *)0x101543;
        roaring_bitmap_add((roaring_bitmap_t *)pcVar15,*(uint32_t *)(__ptr_00 + (long)pFVar6 * 4));
        pFVar6 = (FILE *)((long)&pFVar6->_flags + 1);
      } while ((FILE *)len != pFVar6);
      pcStack_68 = (code *)0x101553;
      free(__ptr_00);
      puVar16 = (undefined8 *)((long)puStack_58 + 1);
      if (puVar16 == puStack_50) {
        return;
      }
      goto LAB_001013e4;
    }
  }
LAB_0010159a:
  iVar3 = (int)lStack_60;
  pcStack_68 = main;
  puVar9 = puStack_58;
  populate_cold_1();
  pFStack_90 = (FILE *)len;
  pcStack_88 = pcVar7;
  pFStack_80 = unaff_R13;
  puStack_78 = puVar16;
  prStack_70 = (roaring_bitmap_t *)pcVar15;
  pcStack_68 = (code *)unaff_RBP;
  if (iVar3 < 2) {
    printf("Usage: %s <comma_separated_integers_file> ...\n",*puVar9);
    return;
  }
  prVar10 = roaring_bitmap_create_with_capacity(0);
  populate(prVar10,iVar3 + -1,(char **)(puVar9 + 1));
  uVar11 = roaring_bitmap_get_cardinality(prVar10);
  printf("Cardinality: %ld\n",uVar11);
  __size = roaring_bitmap_frozen_size_in_bytes(prVar10);
  printf("Serialized size [bytes]: %zu\n",__size);
  pcVar15 = (char *)malloc(__size);
  roaring_bitmap_frozen_serialize(prVar10,pcVar15);
  save(pcVar15,__size);
  free(pcVar15);
  free(prVar10);
  iVar3 = open("/tmp/roaring.bin",0);
  if (iVar3 == -1) {
    die("open");
  }
  else {
    iVar4 = fstat(iVar3,&sStack_120);
    if (iVar4 != -1) {
      pcVar15 = (char *)mmap((void *)0x0,sStack_120.st_size,1,1,iVar3,0);
      if (pcVar15 != (char *)0x0) {
        prVar10 = roaring_bitmap_frozen_view(pcVar15,sStack_120.st_size);
        uVar12 = malloc_usable_size(prVar10);
        printf("Allocation size [bytes]: %zu\n",uVar12);
        roaring_bitmap_free(prVar10);
        munmap(pcVar15,sStack_120.st_size);
        close(iVar3);
        return;
      }
      goto LAB_0010172a;
    }
  }
  die("fstat");
LAB_0010172a:
  pcVar15 = "mmap";
  die("mmap");
  lVar1 = 0;
  if (pcVar15 != (char *)0x0) {
    for (; ((ulong)pcVar15 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
    }
  }
  return;
}

Assistant:

void save(const char *buf, size_t len) {
    int fd = open(FILENAME, O_WRONLY | O_CREAT | O_TRUNC, 0666);
    if (fd == -1) {
        die("open");
    }
    while (len > 0) {
        ssize_t res = write(fd, buf, len);
        if (res == -1) {
            die("write");
        }
        buf += res;
        len -= res;
    }
    close(fd);
}